

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<kj::HttpServer::Connection::LoopResult> __thiscall
kj::HttpServer::Connection::onConnect(Connection *this,ConnectRequest *request)

{
  Coroutine<kj::HttpServer::Connection::LoopResult> *this_00;
  Connection *pCVar1;
  Own<kj::HttpService,_std::nullptr_t> *attachments;
  Promise<void> *this_01;
  PromiseAwaiter<void> *pPVar2;
  PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *pPVar3;
  Promise<kj::HttpServer::Connection::LoopResult> *promise;
  HttpOutputStream *this_02;
  size_t sVar4;
  char *pcVar5;
  long *plVar6;
  long lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  PromiseArenaMember *pPVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  SourceLocation location;
  bool bVar15;
  LoopResult LVar16;
  coroutine_handle<void> coroutine;
  undefined8 *in_RDX;
  FixVoid<kj::HttpServer::Connection::LoopResult> *value;
  Fault local_50;
  char *pcStack_48;
  undefined8 local_40;
  PromiseBase local_38;
  
  coroutine._M_fr_ptr = operator_new(0xc08);
  *(code **)coroutine._M_fr_ptr = onConnect;
  *(code **)((long)coroutine._M_fr_ptr + 8) = onConnect;
  this_00 = (Coroutine<kj::HttpServer::Connection::LoopResult> *)((long)coroutine._M_fr_ptr + 0x10);
  *(ConnectRequest **)((long)coroutine._M_fr_ptr + 0xbe0) = request;
  local_50.exception = (Exception *)0x587dd6;
  pcStack_48 = "onConnect";
  local_40 = 0x1b00001deb;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006dacb0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006dacf8;
  location.function = "onConnect";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x1deb;
  location.columnNumber = 0x1b;
  kj::_::CoroutineBase::CoroutineBase
            ((CoroutineBase *)this_00,coroutine,
             (ExceptionOrValue *)((long)coroutine._M_fr_ptr + 0x98),location);
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x10) = &PTR_destroy_006dacb0;
  *(undefined ***)((long)coroutine._M_fr_ptr + 0x20) = &PTR_traceEvent_006dacf8;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x98) = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0x230) = 0;
  (this->super_Response)._vptr_Response = (_func_int **)this_00;
  if (((char)request[0x14].authority.content.size_ == '\x01') &&
     (*(int *)&request[0x15].authority.content.ptr - 1U < 2)) {
    *(undefined4 *)&request[0x15].authority.content.ptr = 0;
  }
  *(undefined4 *)&request[0x15].authority.content.ptr = 2;
  *(undefined1 *)&request[0x14].authority.content.size_ = 1;
  sVar4 = request[8].authority.content.size_;
  local_38.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  if (*(ulong *)(sVar4 + 0x58) < 2) {
    if (*(ulong *)(sVar4 + 0x68) < 2) {
      uVar11 = *(undefined4 *)in_RDX;
      uVar12 = *(undefined4 *)((long)in_RDX + 4);
      uVar13 = *(undefined4 *)(in_RDX + 1);
      uVar14 = *(undefined4 *)((long)in_RDX + 0xc);
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0xb40) = 2;
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0xb50) = uVar11;
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0xb54) = uVar12;
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0xb58) = uVar13;
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0xb5c) = uVar14;
      *(ConnectRequest **)((long)coroutine._M_fr_ptr + 0xb60) = request + 8;
      *(ConnectRequest **)((long)coroutine._M_fr_ptr + 0xb68) = request;
      pcVar5 = request[3].authority.content.ptr;
      (*(code *)**(undefined8 **)pcVar5)
                ((long)coroutine._M_fr_ptr + 0xba0,pcVar5,(long)coroutine._M_fr_ptr + 0xb40);
      if (*(char *)((long)&request[0x16].authority.content.ptr + 6) == '\x01') {
        *(FixVoid<kj::HttpServer::Connection::LoopResult> *)((long)coroutine._M_fr_ptr + 0xbf4) =
             BREAK_LOOP_CONN_ERR;
        kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::fulfill
                  (this_00,(FixVoid<kj::HttpServer::Connection::LoopResult> *)
                           ((long)coroutine._M_fr_ptr + 0xbf4));
      }
      else {
        lVar7 = *(long *)((long)coroutine._M_fr_ptr + 0xba8);
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0xba8) = 0;
        if (lVar7 == 0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70]>
                    (&local_50,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                     ,0x1e13,FAILED,"kj::mv(maybeService) != nullptr",
                     "\"SuspendableHttpServiceFactory did not suspend, but returned kj::none.\"",
                     (char (*) [70])
                     "SuspendableHttpServiceFactory did not suspend, but returned kj::none.");
          kj::_::Debug::Fault::fatal(&local_50);
        }
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0xb90) =
             *(undefined8 *)((long)coroutine._M_fr_ptr + 0xba0);
        *(long *)((long)coroutine._M_fr_ptr + 0xb98) = lVar7;
        getConnectStream((Connection *)((long)coroutine._M_fr_ptr + 0xb80));
        attachments = (Own<kj::HttpService,_std::nullptr_t> *)((long)coroutine._M_fr_ptr + 0xbb0);
        uVar8 = *in_RDX;
        uVar9 = in_RDX[1];
        *(undefined1 *)((long)coroutine._M_fr_ptr + 0xb70) = 0;
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0xb78) = 0;
        (**(code **)(**(long **)((long)coroutine._M_fr_ptr + 0xb98) + 8))
                  (attachments,*(long **)((long)coroutine._M_fr_ptr + 0xb98),uVar8,uVar9,request + 8
                   ,*(undefined8 *)((long)coroutine._M_fr_ptr + 0xb88),
                   &(request->authority).content.size_,(long)coroutine._M_fr_ptr + 0xb70);
        this_01 = (Promise<void> *)((long)coroutine._M_fr_ptr + 3000);
        Promise<void>::
        attach<kj::Own<kj::HttpService,decltype(nullptr)>,kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
                  (this_01,attachments,
                   (Own<kj::AsyncIoStream,_std::nullptr_t> *)((long)coroutine._M_fr_ptr + 0xb90));
        pPVar2 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x5a8);
        co_await<void>(pPVar2,this_01);
        *(undefined1 *)((long)coroutine._M_fr_ptr + 0xc00) = 2;
        bVar15 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                           ((PromiseAwaiterBase *)pPVar2,(CoroutineBase *)this_00);
        if (bVar15) {
          return (Promise<kj::HttpServer::Connection::LoopResult>)(PromiseNode *)local_38.node.ptr;
        }
        kj::_::PromiseAwaiter<void>::await_resume(pPVar2);
        if (*(char *)((long)coroutine._M_fr_ptr + 0x5c0) == '\x01') {
          Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x5c8));
        }
        kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar2);
        pPVar10 = &((this_01->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
        if (pPVar10 != (PromiseArenaMember *)0x0) {
          (this_01->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose(pPVar10);
        }
        pPVar10 = (PromiseArenaMember *)attachments->disposer;
        if (pPVar10 != (PromiseArenaMember *)0x0) {
          attachments->disposer = (Disposer *)0x0;
          kj::_::PromiseDisposer::dispose(pPVar10);
        }
        lVar7 = *(long *)((long)coroutine._M_fr_ptr + 0xbe0);
        if (*(char *)(lVar7 + 0x178) == '\x01') {
          pPVar3 = (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)
                   ((long)coroutine._M_fr_ptr + 0x3f0);
          promise = (Promise<kj::HttpServer::Connection::LoopResult> *)
                    ((long)coroutine._M_fr_ptr + 0xbd0);
          (promise->super_PromiseBase).node.ptr = *(PromiseNode **)(lVar7 + 0x180);
          *(undefined8 *)(lVar7 + 0x180) = 0;
          *(undefined1 *)(lVar7 + 0x178) = 0;
          co_await<kj::HttpServer::Connection::LoopResult>(pPVar3,promise);
          *(undefined1 *)((long)coroutine._M_fr_ptr + 0xc00) = 3;
          bVar15 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                             ((PromiseAwaiterBase *)pPVar3,(CoroutineBase *)this_00);
          if (bVar15) {
            return (Promise<kj::HttpServer::Connection::LoopResult>)(PromiseNode *)local_38.node.ptr
            ;
          }
          LVar16 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume
                             (pPVar3);
          *(FixVoid<kj::HttpServer::Connection::LoopResult> *)((long)coroutine._M_fr_ptr + 0xbf8) =
               LVar16;
          kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::fulfill
                    (this_00,(FixVoid<kj::HttpServer::Connection::LoopResult> *)
                             ((long)coroutine._M_fr_ptr + 0xbf8));
          if (*(char *)((long)coroutine._M_fr_ptr + 0x408) == '\x01') {
            Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x410));
          }
          kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar3);
          pPVar10 = &((promise->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
          if (pPVar10 != (PromiseArenaMember *)0x0) {
            (promise->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
            kj::_::PromiseDisposer::dispose(pPVar10);
          }
        }
        else {
          if (*(char *)(lVar7 + 0x141) == '\x01') {
            value = (FixVoid<kj::HttpServer::Connection::LoopResult> *)
                    ((long)coroutine._M_fr_ptr + 0xbe8);
          }
          else {
            this_02 = (HttpOutputStream *)((long)coroutine._M_fr_ptr + 0xbd8);
            anon_unknown_36::HttpOutputStream::flush(this_02);
            pPVar2 = (PromiseAwaiter<void> *)((long)coroutine._M_fr_ptr + 0x238);
            co_await<void>(pPVar2,(Promise<void> *)this_02);
            *(undefined1 *)((long)coroutine._M_fr_ptr + 0xc00) = 4;
            bVar15 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                               ((PromiseAwaiterBase *)pPVar2,(CoroutineBase *)this_00);
            if (bVar15) {
              return (Promise<kj::HttpServer::Connection::LoopResult>)
                     (PromiseNode *)local_38.node.ptr;
            }
            kj::_::PromiseAwaiter<void>::await_resume(pPVar2);
            kj::_::PromiseAwaiter<void>::~PromiseAwaiter(pPVar2);
            value = (FixVoid<kj::HttpServer::Connection::LoopResult> *)
                    ((long)coroutine._M_fr_ptr + 0xbfc);
            pPVar10 = (PromiseArenaMember *)
                      (this_02->
                      super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>).
                      currentWrapper.ptr;
            if (pPVar10 != (PromiseArenaMember *)0x0) {
              (this_02->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>).
              currentWrapper.ptr = (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)0x0;
              kj::_::PromiseDisposer::dispose(pPVar10);
            }
          }
          *value = BREAK_LOOP_CONN_ERR;
          kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::fulfill(this_00,value);
        }
        plVar6 = *(long **)((long)coroutine._M_fr_ptr + 0xb88);
        if (plVar6 != (long *)0x0) {
          *(undefined8 *)((long)coroutine._M_fr_ptr + 0xb88) = 0;
          (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0xb80))
                    (*(undefined8 **)((long)coroutine._M_fr_ptr + 0xb80),
                     (long)plVar6 + *(long *)(*plVar6 + -0x10));
        }
        plVar6 = *(long **)((long)coroutine._M_fr_ptr + 0xb98);
        if (plVar6 != (long *)0x0) {
          *(undefined8 *)((long)coroutine._M_fr_ptr + 0xb98) = 0;
          (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0xb90))
                    (*(undefined8 **)((long)coroutine._M_fr_ptr + 0xb90),
                     (long)plVar6 + *(long *)(*plVar6 + -0x10));
        }
      }
      plVar6 = *(long **)((long)coroutine._M_fr_ptr + 0xba8);
      if (plVar6 != (long *)0x0) {
        *(undefined8 *)((long)coroutine._M_fr_ptr + 0xba8) = 0;
        (**(code **)**(undefined8 **)((long)coroutine._M_fr_ptr + 0xba0))
                  (*(undefined8 **)((long)coroutine._M_fr_ptr + 0xba0),
                   (long)plVar6 + *(long *)(*plVar6 + -0x10));
      }
    }
    else {
      pCVar1 = (Connection *)((long)coroutine._M_fr_ptr + 0xbc0);
      *(undefined4 *)((long)coroutine._M_fr_ptr + 0xb08) = 400;
      *(char **)((long)coroutine._M_fr_ptr + 0xb10) = "Bad Request";
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0xb18) = 0xc;
      *(char **)((long)coroutine._M_fr_ptr + 0xb20) = "Bad Request";
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0xb28) = 0xc;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0xb30) = 0;
      *(undefined8 *)((long)coroutine._M_fr_ptr + 0xb38) = 0;
      sendError(pCVar1,*(ProtocolError *)((long)coroutine._M_fr_ptr + 0xb08));
      pPVar3 = (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)
               ((long)coroutine._M_fr_ptr + 0x918);
      co_await<kj::HttpServer::Connection::LoopResult>
                (pPVar3,(Promise<kj::HttpServer::Connection::LoopResult> *)pCVar1);
      *(undefined1 *)((long)coroutine._M_fr_ptr + 0xc00) = 1;
      bVar15 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                         ((PromiseAwaiterBase *)pPVar3,(CoroutineBase *)this_00);
      if (bVar15) {
        return (Promise<kj::HttpServer::Connection::LoopResult>)(PromiseNode *)local_38.node.ptr;
      }
      LVar16 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume(pPVar3);
      *(FixVoid<kj::HttpServer::Connection::LoopResult> *)((long)coroutine._M_fr_ptr + 0xbf0) =
           LVar16;
      kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::fulfill
                (this_00,(FixVoid<kj::HttpServer::Connection::LoopResult> *)
                         ((long)coroutine._M_fr_ptr + 0xbf0));
      if (*(char *)((long)coroutine._M_fr_ptr + 0x930) == '\x01') {
        Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x938));
      }
      kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar3);
      pPVar10 = (PromiseArenaMember *)(pCVar1->super_Response)._vptr_Response;
      if (pPVar10 != (PromiseArenaMember *)0x0) {
        (pCVar1->super_Response)._vptr_Response = (_func_int **)0x0;
        kj::_::PromiseDisposer::dispose(pPVar10);
      }
    }
  }
  else {
    pCVar1 = (Connection *)((long)coroutine._M_fr_ptr + 0xbc8);
    *(undefined4 *)((long)coroutine._M_fr_ptr + 0xad0) = 400;
    *(char **)((long)coroutine._M_fr_ptr + 0xad8) = "Bad Request";
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0xae0) = 0xc;
    *(char **)((long)coroutine._M_fr_ptr + 0xae8) = "Bad Request";
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0xaf0) = 0xc;
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0xaf8) = 0;
    *(undefined8 *)((long)coroutine._M_fr_ptr + 0xb00) = 0;
    sendError(pCVar1,*(ProtocolError *)((long)coroutine._M_fr_ptr + 0xad0));
    pPVar3 = (PromiseAwaiter<kj::HttpServer::Connection::LoopResult> *)
             ((long)coroutine._M_fr_ptr + 0x760);
    co_await<kj::HttpServer::Connection::LoopResult>
              (pPVar3,(Promise<kj::HttpServer::Connection::LoopResult> *)pCVar1);
    *(undefined1 *)((long)coroutine._M_fr_ptr + 0xc00) = 0;
    bVar15 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                       ((PromiseAwaiterBase *)pPVar3,(CoroutineBase *)this_00);
    if (bVar15) {
      return (Promise<kj::HttpServer::Connection::LoopResult>)(PromiseNode *)local_38.node.ptr;
    }
    LVar16 = kj::_::PromiseAwaiter<kj::HttpServer::Connection::LoopResult>::await_resume(pPVar3);
    *(FixVoid<kj::HttpServer::Connection::LoopResult> *)((long)coroutine._M_fr_ptr + 0xbec) = LVar16
    ;
    kj::_::Coroutine<kj::HttpServer::Connection::LoopResult>::fulfill
              (this_00,(FixVoid<kj::HttpServer::Connection::LoopResult> *)
                       ((long)coroutine._M_fr_ptr + 0xbec));
    if (*(char *)((long)coroutine._M_fr_ptr + 0x778) == '\x01') {
      Exception::~Exception((Exception *)((long)coroutine._M_fr_ptr + 0x780));
    }
    kj::_::PromiseAwaiterBase::~PromiseAwaiterBase((PromiseAwaiterBase *)pPVar3);
    pPVar10 = (PromiseArenaMember *)(pCVar1->super_Response)._vptr_Response;
    if (pPVar10 != (PromiseArenaMember *)0x0) {
      (pCVar1->super_Response)._vptr_Response = (_func_int **)0x0;
      kj::_::PromiseDisposer::dispose(pPVar10);
    }
  }
  *(undefined8 *)coroutine._M_fr_ptr = 0;
  *(undefined1 *)((long)coroutine._M_fr_ptr + 0xc00) = 5;
  return (Promise<kj::HttpServer::Connection::LoopResult>)(PromiseNode *)local_38.node.ptr;
}

Assistant:

kj::Promise<LoopResult> onConnect(HttpHeaders::ConnectRequest& request) {
    auto& headers = httpInput.getHeaders();

    currentMethod = HttpConnectMethod();

    // The HTTP specification says that CONNECT requests have no meaningful payload
    // but stops short of saying that CONNECT *cannot* have a payload. Implementations
    // can choose to either accept payloads or reject them. We choose to reject it.
    // Specifically, if there are Content-Length or Transfer-Encoding headers in the
    // request headers, we'll automatically reject the CONNECT request.
    //
    // The key implication here is that any data that immediately follows the headers
    // block of the CONNECT request is considered to be part of the tunnel if it is
    // established.

    if (headers.get(HttpHeaderId::CONTENT_LENGTH) != kj::none) {
      co_return co_await sendError(HttpHeaders::ProtocolError {
        400,
        "Bad Request"_kj,
        "Bad Request"_kj,
        nullptr,
      });
    }
    if (headers.get(HttpHeaderId::TRANSFER_ENCODING) != kj::none) {
      co_return co_await sendError(HttpHeaders::ProtocolError {
        400,
        "Bad Request"_kj,
        "Bad Request"_kj,
        nullptr,
      });
    }

    SuspendableRequest suspendable(*this, HttpConnectMethod(), request.authority, headers);
    auto maybeService = factory(suspendable);

    if (suspended) {
      co_return BREAK_LOOP_CONN_ERR;
    }

    auto service = KJ_ASSERT_NONNULL(kj::mv(maybeService),
        "SuspendableHttpServiceFactory did not suspend, but returned kj::none.");
    auto connectStream = getConnectStream();
    co_await service->connect(
        request.authority, headers, *connectStream, *this, {})
        .attach(kj::mv(service), kj::mv(connectStream));


    KJ_IF_SOME(p, tunnelRejected) {
      // reject() was called to reject a CONNECT attempt.
      // Finish sending and close the connection.
      auto promise = kj::mv(p);
      tunnelRejected = kj::none;
      co_return co_await promise;
    }

    if (httpOutput.isBroken()) {
      co_return BREAK_LOOP_CONN_ERR;
    }

    co_await httpOutput.flush();
    co_return BREAK_LOOP_CONN_ERR;
  }